

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_coin.cpp
# Opt level: O2

void __thiscall
cfdcapi_coin_EstimateFeeTest_Test::~cfdcapi_coin_EstimateFeeTest_Test
          (cfdcapi_coin_EstimateFeeTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(cfdcapi_coin, EstimateFeeTest) {

  AddressFactory factory;
  std::vector<UtxoData> utxos = {
    UtxoData{
      static_cast<uint32_t>(12),
      BlockHash("590ba2283fbe5fb9363c74417bc1cb3f76d4df9d31890f9124b9e1706136b4f4"),
      Txid("ffe2f9aa4e2c2adb1676008aa07aec5f64149470abb5d89d91b26dfba14e9318"),
      static_cast<uint32_t>(0),
      Script("a914155801788fcd51f57e097a0b6c30f1b69057290d87"),
      Script("001477567d12cf82a3ef6e9bb0ab3a1aba7f65410cbd"),
      factory.GetAddress("33dsYKS5E5Vp3LhAw3krvhzNaWtqmrH29k"),
      "sh(wpkh([ef735203/0\'/0\'/5\']03948c01f159b4204b682668d6e850440564b6610c0e5bf30da684b2131f77c449))#2u75feqc",
      Amount::CreateBySatoshiAmount(600000000),
      static_cast<AddressType>(0),
      nullptr,
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialAssetId(),
      ElementsConfidentialAddress(),
      BlindFactor(),
      BlindFactor(),
      ConfidentialValue(),
#endif  // CFD_DISABLE_ELEMENTS
      Script()
    },
    UtxoData{
      22,
      BlockHash("e05419389a3aa71017eb4dd1d9eec73500971b86aab2eb0db116707c7be67996"),
      Txid("d68154ae19408850308967b2cb1b84a92166829610fb2321548b655c4a747c79"),
      0,
      Script("a914155801788fcd51f57e097a0b6c30f1b69057290d87"),
      Script("001477567d12cf82a3ef6e9bb0ab3a1aba7f65410cbd"),
      factory.GetAddress("33dsYKS5E5Vp3LhAw3krvhzNaWtqmrH29k"),
      "sh(wpkh([ef735203/0\'/0\'/5\']03948c01f159b4204b682668d6e850440564b6610c0e5bf30da684b2131f77c449))#2u75feqc",
      Amount::CreateBySatoshiAmount(700000000),
      static_cast<AddressType>(0),
#ifndef CFD_DISABLE_ELEMENTS
      nullptr,
      ConfidentialAssetId(),
      ElementsConfidentialAddress(),
      BlindFactor(),
      BlindFactor(),
      ConfidentialValue(),
#else
      nullptr,
#endif  // CFD_DISABLE_ELEMENTS
      Script()
    }
  };

  // 1 output data
  static const char* const kTxData = "02000000034cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff81ddd34c6c0c32544e3b89f5e24c6cd7afca62f2b5069281ac9fced6251191d20000000000ffffffff81ddd34c6c0c32544e3b89f5e24c6cd7afca62f2b5069281ac9fced6251191d20100000000ffffffff030200000000000000220020c5ae4ff17cec055e964b573601328f3f879fa441e53ef88acdfd4d8e8df429ef406f400100000000220020ea5a7208cddfbc20dd93e12bf29deb00b68c056382a502446c9c5b55490954d215cd5b0700000000220020f39f6272ba6b57918eb047c5dc44fb475356b0f24c12fca39b19284e80008a4200000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* fee_handle = nullptr;
  ret = CfdInitializeEstimateFee(handle, &fee_handle, false);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    for (auto& utxo : utxos) {
      ret = CfdAddTxInForEstimateFee(
          handle, fee_handle, utxo.txid.GetHex().c_str(), utxo.vout,
          utxo.descriptor.c_str(), nullptr,
          false, false, false, 0, nullptr);
      //ret = CfdAddTxInputForEstimateFee(
      //    handle, fee_handle, utxo.txid.GetHex().c_str(), utxo.vout,
      //    utxo.descriptor.c_str(), nullptr,
      //    false, false, false, nullptr, 0, 0, nullptr);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    int64_t tx_fee, utxo_fee;
    ret = CfdFinalizeEstimateFee(
        handle, fee_handle, kTxData, nullptr, &tx_fee, &utxo_fee, true, 20.0);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(static_cast<int64_t>(2820), tx_fee);
    EXPECT_EQ(static_cast<int64_t>(3660), utxo_fee);

    ret = CfdFreeEstimateFeeHandle(handle, fee_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}